

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeForces::FluctuatingChargeForces
          (FluctuatingChargeForces *this,SimInfo *info)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x424f0e);
  FluctuatingChargeAtomData::FluctuatingChargeAtomData((FluctuatingChargeAtomData *)0x424f1c);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x424f2f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x424f40);
  std::vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ::vector((vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
            *)0x424f51);
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  return;
}

Assistant:

FluctuatingChargeForces::FluctuatingChargeForces(SimInfo* info) :
      info_(info), initialized_(false) {}